

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

vector<UniValue,_std::allocator<UniValue>_> * __thiscall
ArgsManager::GetSettingsList
          (vector<UniValue,_std::allocator<UniValue>_> *__return_storage_ptr__,ArgsManager *this,
          string *arg)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_50;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_50,&this->cs_args,"cs_args"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x342,false);
  SettingName(&local_40,arg);
  bVar1 = UseDefaultSection(this,arg);
  common::GetSettingsList
            (__return_storage_ptr__,&this->m_settings,&this->m_network,&local_40,!bVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<common::SettingsValue> ArgsManager::GetSettingsList(const std::string& arg) const
{
    LOCK(cs_args);
    return common::GetSettingsList(m_settings, m_network, SettingName(arg), !UseDefaultSection(arg));
}